

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

QRect __thiscall
QStyle::itemTextRect
          (QStyle *this,QFontMetrics *metrics,QRect *rect,int alignment,bool enabled,QString *text)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QFontMetrics *in_RDI;
  byte in_R8B;
  QRect *in_R9;
  long in_FS_OFFSET;
  QRect QVar5;
  int h;
  int w;
  int y;
  int x;
  QRect result;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 uVar6;
  int in_stack_ffffffffffffff64;
  QRect *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 local_48;
  QString *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined8 local_18;
  QString *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  QRect::getRect(in_R9,(int *)in_RDI,
                 (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar2 = QString::isEmpty((QString *)0x40a022);
  if (bVar2) {
    QRect::QRect(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    local_18 = local_48;
    local_10 = in_stack_ffffffffffffffc0;
  }
  else {
    uVar6 = 0;
    QVar5 = QFontMetrics::boundingRect
                      (in_RDI,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74
                       ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8._0_4_,
                       in_stack_ffffffffffffffc8._8_8_);
    local_18 = QVar5._0_8_;
    local_10 = QVar5._8_8_;
    if ((in_R8B & 1) == 0) {
      pQVar4 = proxy((QStyle *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0,0,0);
      if (iVar3 != 0) {
        QRect::width(in_R9);
        QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff64,uVar6),
                        (int)((ulong)in_R9 >> 0x20));
        QRect::height(in_R9);
        QRect::setHeight((QRect *)CONCAT44(in_stack_ffffffffffffff64,uVar6),
                         (int)((ulong)in_R9 >> 0x20));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar5.x2.m_i = (int)local_10;
  QVar5.x1.m_i = (undefined4)local_18;
  QVar5.y1.m_i = local_18._4_4_;
  QVar5.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar5;
}

Assistant:

QRect QStyle::itemTextRect(const QFontMetrics &metrics, const QRect &rect, int alignment, bool enabled,
                       const QString &text) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);
    if (!text.isEmpty()) {
        result = metrics.boundingRect(x, y, w, h, alignment, text);
        if (!enabled && proxy()->styleHint(SH_EtchDisabledText)) {
            result.setWidth(result.width()+1);
            result.setHeight(result.height()+1);
        }
    } else {
        result = QRect(x, y, w, h);
    }
    return result;
}